

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

Constraint * __thiscall
slang::ast::ConstraintBlockSymbol::getConstraints(ConstraintBlockSymbol *this)

{
  LookupLocation lookupLocation;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view className;
  SourceRange sourceRange;
  string_view declName;
  bool bVar1;
  SymbolIndex SVar2;
  int iVar3;
  ConstraintDeclarationSyntax *pCVar4;
  InvalidConstraint *pIVar5;
  reference pTVar6;
  SourceLocation location;
  ConstraintBlockSyntax *pCVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar8;
  socklen_t __len;
  socklen_t __len_00;
  Symbol *in_RDI;
  Token TVar9;
  Diagnostic *diag_3;
  bitmask<slang::ast::ConstraintBlockFlags> declFlags;
  Diagnostic *diag_2;
  Token qual;
  iterator __end3;
  iterator __begin3;
  TokenList *__range3;
  bool declStatic;
  Diagnostic *diag_1;
  Diagnostic *diag;
  ConstraintDeclarationSyntax *cds;
  DiagCode code;
  type *used;
  type *index;
  type *declSyntax;
  Compilation *comp;
  Scope *outerScope;
  Symbol *parentSym;
  ASTContext context;
  Scope *scope;
  SyntaxNode *syntax;
  span<slang::parsing::Token,_18446744073709551615UL> *this_00;
  Scope *in_stack_fffffffffffffd20;
  Diagnostic *this_01;
  SourceLocation in_stack_fffffffffffffd28;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd30;
  Scope *pSVar10;
  Scope *in_stack_fffffffffffffd38;
  Scope *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  SymbolIndex SVar11;
  size_t in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  Symbol *this_02;
  undefined4 *local_288;
  byte local_269;
  Token in_stack_fffffffffffffdb8;
  SourceLocation in_stack_fffffffffffffdc8;
  DiagCode in_stack_fffffffffffffdd4;
  DiagCode DVar12;
  bitmask<slang::ast::ConstraintBlockFlags> local_21d;
  underlying_type local_21c;
  underlying_type local_21b;
  underlying_type local_21a;
  bitmask<slang::ast::ConstraintBlockFlags> local_219;
  SourceLocation local_218;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  Compilation *in_stack_fffffffffffffdf8;
  Info *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  bitmask<slang::ast::ConstraintBlockFlags> local_1d9;
  undefined8 local_1d8;
  Info *local_1d0;
  Token *local_1c8;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_1c0;
  TokenList *local_1b8;
  byte local_1a9;
  Scope *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  SourceLocation in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  DiagCode DVar13;
  Token local_178;
  SourceLocation local_168;
  undefined4 local_15c;
  Diagnostic *local_158;
  undefined8 local_150;
  SourceLocation local_148;
  undefined4 local_13c;
  SourceRange local_138;
  undefined4 local_124;
  Diagnostic *local_120;
  bitmask<slang::ast::ConstraintBlockFlags> local_111;
  size_t in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  bitmask<slang::ast::ConstraintBlockFlags> local_df;
  undefined4 local_de;
  bitmask<slang::ast::ConstraintBlockFlags> local_d9;
  __tuple_element_t<2UL,_tuple<const_SyntaxNode_*,_SymbolIndex,_bool_*>_> *local_d8;
  SymbolIndex *local_d0;
  __tuple_element_t<0UL,_tuple<const_SyntaxNode_*,_SymbolIndex,_bool_*>_> *local_c8;
  span<slang::parsing::Token,_18446744073709551615UL> *local_c0;
  Diagnostic *local_b8;
  size_t local_b0;
  char *local_a8;
  Compilation *local_88;
  Scope *local_80;
  Symbol *local_78;
  bitmask<slang::ast::ASTFlags> local_70;
  undefined8 local_68;
  undefined8 local_60;
  sockaddr local_58 [3];
  Scope *local_20;
  SyntaxNode *local_18;
  Constraint *local_8;
  
  DVar13 = SUB84((ulong)in_stack_fffffffffffffe70 >> 0x20,0);
  if (in_RDI[2].name._M_len == 0) {
    local_18 = Symbol::getSyntax(in_RDI);
    local_20 = Symbol::getParentScope(in_RDI);
    local_68 = LookupLocation::max;
    local_60 = DAT_00dd1ab8;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_70,None);
    lookupLocation._8_8_ = in_stack_fffffffffffffd40;
    lookupLocation.scope = in_stack_fffffffffffffd38;
    ASTContext::ASTContext
              ((ASTContext *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,lookupLocation,
               in_stack_fffffffffffffd30);
    if (local_18->kind == ConstraintPrototype) {
      local_78 = Scope::asSymbol(local_20);
      local_80 = Symbol::getParentScope(local_78);
      local_88 = Scope::getCompilation(local_80);
      local_b0 = (local_78->name)._M_len;
      local_a8 = (local_78->name)._M_str;
      this_00 = (span<slang::parsing::Token,_18446744073709551615UL> *)(in_RDI->name)._M_len;
      this_01 = (Diagnostic *)(in_RDI->name)._M_str;
      className._M_str = in_stack_fffffffffffffe08;
      className._M_len = (size_t)in_stack_fffffffffffffe00;
      declName._M_str = in_stack_fffffffffffffef8;
      declName._M_len = in_stack_fffffffffffffef0;
      local_c0 = this_00;
      local_b8 = this_01;
      Compilation::findOutOfBlockDecl
                (in_stack_fffffffffffffdf8,
                 (Scope *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),className,
                 declName);
      local_c8 = std::get<0ul,slang::syntax::SyntaxNode_const*,slang::ast::SymbolIndex,bool*>
                           ((tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                             *)0x334aa5);
      local_d0 = std::get<1ul,slang::syntax::SyntaxNode_const*,slang::ast::SymbolIndex,bool*>
                           ((tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                             *)0x334aba);
      local_d8 = std::get<2ul,slang::syntax::SyntaxNode_const*,slang::ast::SymbolIndex,bool*>
                           ((tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                             *)0x334acf);
      pSVar10 = (Scope *)in_stack_fffffffffffffdb8.info;
      if ((*local_c8 != (__tuple_element_t<0UL,_tuple<const_SyntaxNode_*,_SymbolIndex,_bool_*>_>)0x0
          ) && ((*local_c8)->kind == ConstraintDeclaration)) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->name);
        pSVar10 = (Scope *)in_stack_fffffffffffffdb8.info;
        if (!bVar1) {
          pCVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ConstraintDeclarationSyntax>
                             (*local_c8);
          **local_d8 = true;
          this_02 = in_RDI + 2;
          bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_111,Pure);
          bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                            ((bitmask<slang::ast::ConstraintBlockFlags> *)this_01,
                             (bitmask<slang::ast::ConstraintBlockFlags> *)this_00);
          DVar12 = SUB84(in_stack_fffffffffffffd30.m_bits >> 0x20,0);
          if (bVar1) {
            local_124 = 0xd0006;
            not_null<slang::syntax::NameSyntax_*>::operator->
                      ((not_null<slang::syntax::NameSyntax_*> *)0x334d3a);
            local_138 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_02);
            sourceRange.startLoc._4_4_ = in_stack_fffffffffffffe64;
            sourceRange.startLoc._0_4_ = in_stack_fffffffffffffe60;
            sourceRange.endLoc = in_stack_fffffffffffffe68;
            local_120 = Scope::addDiag(in_stack_fffffffffffffe58,DVar13,sourceRange);
            local_13c = 0x50001;
            local_148 = in_RDI->location;
            Diagnostic::addNote(this_01,DVar12,in_stack_fffffffffffffd28);
            Scope::getCompilation(local_20);
            local_150 = 0;
            pIVar5 = BumpAllocator::emplace<slang::ast::InvalidConstraint,decltype(nullptr)>
                               ((BumpAllocator *)this_01,&this_00->_M_ptr);
            in_RDI[2].name._M_len = (size_t)pIVar5;
            return (Constraint *)in_RDI[2].name._M_len;
          }
          *(SymbolIndex *)&in_RDI[2].name._M_str = *local_d0;
          SVar11 = *local_d0;
          SVar2 = Symbol::getIndex(local_78);
          if (SVar11 <= SVar2) {
            local_15c = 0x6e0006;
            not_null<slang::syntax::NameSyntax_*>::operator->
                      ((not_null<slang::syntax::NameSyntax_*> *)0x334e79);
            local_178 = slang::syntax::SyntaxNode::getLastToken
                                  ((SyntaxNode *)
                                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
            local_168 = parsing::Token::location(&local_178);
            local_158 = Scope::addDiag((Scope *)in_stack_fffffffffffffdb8.info,
                                       in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
            arg_00._M_str = (char *)this_02;
            arg_00._M_len = in_stack_fffffffffffffd68;
            Diagnostic::operator<<((Diagnostic *)CONCAT44(SVar11,in_stack_fffffffffffffd60),arg_00);
            arg_01._M_str = (char *)this_02;
            arg_01._M_len = in_stack_fffffffffffffd68;
            Diagnostic::operator<<((Diagnostic *)CONCAT44(SVar11,in_stack_fffffffffffffd60),arg_01);
            Diagnostic::addNote(this_01,SUB84(in_stack_fffffffffffffd30.m_bits >> 0x20,0),
                                in_stack_fffffffffffffd28);
          }
          local_1a9 = 0;
          local_1b8 = &pCVar4->qualifiers;
          local_1c0._M_current =
               (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin(this_00);
          local_1c8 = (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::end
                                         ((span<slang::parsing::Token,_18446744073709551615UL> *)
                                          in_stack_fffffffffffffd28);
          do {
            bVar1 = __gnu_cxx::
                    operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                              ((__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                                *)this_01,
                               (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                                *)this_00);
            pSVar10 = (Scope *)in_stack_fffffffffffffdb8.info;
            DVar13 = SUB84(in_stack_fffffffffffffd30.m_bits >> 0x20,0);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00335032:
              uVar8 = (uint)(local_1a9 & 1);
              bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_1d9,Static);
              bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                                ((bitmask<slang::ast::ConstraintBlockFlags> *)this_01,
                                 (bitmask<slang::ast::ConstraintBlockFlags> *)this_00);
              if (uVar8 != bVar1) {
                in_stack_fffffffffffffd40 = local_80;
                slang::syntax::SyntaxNode::getFirstToken
                          ((SyntaxNode *)CONCAT44(uVar8,in_stack_fffffffffffffd50));
                parsing::Token::location((Token *)&stack0xfffffffffffffdf8);
                Scope::addDiag(pSVar10,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
                local_218 = in_RDI->location;
                Diagnostic::addNote(this_01,DVar13,in_stack_fffffffffffffd28);
              }
              bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_219);
              addSpecifierFlags((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)
                                in_stack_fffffffffffffd40,
                                (bitmask<slang::ast::ConstraintBlockFlags> *)
                                in_stack_fffffffffffffd38);
              local_21c = (underlying_type)ast::operator|(None,None);
              bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_21d,Final);
              local_21b = (underlying_type)
                          bitmask<slang::ast::ConstraintBlockFlags>::operator|
                                    ((bitmask<slang::ast::ConstraintBlockFlags> *)
                                     in_stack_fffffffffffffd28,
                                     (bitmask<slang::ast::ConstraintBlockFlags> *)this_01);
              local_21a = (underlying_type)
                          bitmask<slang::ast::ConstraintBlockFlags>::operator&
                                    ((bitmask<slang::ast::ConstraintBlockFlags> *)
                                     in_stack_fffffffffffffd28,
                                     (bitmask<slang::ast::ConstraintBlockFlags> *)this_01);
              bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::operator==
                                ((bitmask<slang::ast::ConstraintBlockFlags> *)this_01,
                                 (bitmask<slang::ast::ConstraintBlockFlags> *)this_00);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                DVar12.subsystem = Declarations;
                DVar12.code = 0x78;
                pSVar10 = local_80;
                not_null<slang::syntax::NameSyntax_*>::operator->
                          ((not_null<slang::syntax::NameSyntax_*> *)0x335222);
                DVar13 = SUB84((ulong)pSVar10 >> 0x20,0);
                TVar9 = slang::syntax::SyntaxNode::getLastToken
                                  ((SyntaxNode *)CONCAT44(uVar8,in_stack_fffffffffffffd50));
                pSVar10 = (Scope *)TVar9.info;
                location = parsing::Token::location((Token *)&stack0xfffffffffffffdb8);
                Scope::addDiag(pSVar10,DVar12,location);
                Diagnostic::addNote(this_01,DVar13,in_stack_fffffffffffffd28);
              }
              pCVar7 = not_null<slang::syntax::ConstraintBlockSyntax_*>::operator*
                                 ((not_null<slang::syntax::ConstraintBlockSyntax_*> *)0x3352c4);
              iVar3 = Constraint::bind((int)pCVar7,local_58,__len);
              in_RDI[2].name._M_len = CONCAT44(extraout_var,iVar3);
              return (Constraint *)in_RDI[2].name._M_len;
            }
            pTVar6 = __gnu_cxx::
                     __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                     ::operator*(&local_1c0);
            pSVar10 = (Scope *)in_stack_fffffffffffffdb8.info;
            DVar13 = SUB84(in_stack_fffffffffffffd30.m_bits >> 0x20,0);
            local_1d8._0_2_ = pTVar6->kind;
            local_1d8._2_1_ = pTVar6->field_0x2;
            local_1d8._3_1_ = pTVar6->numFlags;
            local_1d8._4_4_ = pTVar6->rawLen;
            local_1d0 = pTVar6->info;
            if ((undefined2)local_1d8 == 0x11c) {
              local_1a9 = 1;
              goto LAB_00335032;
            }
            __gnu_cxx::
            __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
            ::operator++(&local_1c0);
          } while( true );
        }
      }
      bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_d9,Pure);
      bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                        ((bitmask<slang::ast::ConstraintBlockFlags> *)this_01,
                         (bitmask<slang::ast::ConstraintBlockFlags> *)this_00);
      local_269 = 0;
      if (!bVar1) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->name);
        local_269 = bVar1 ^ 0xff;
      }
      if ((local_269 & 1) != 0) {
        bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_df,ExplicitExtern);
        bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                          ((bitmask<slang::ast::ConstraintBlockFlags> *)this_01,
                           (bitmask<slang::ast::ConstraintBlockFlags> *)this_00);
        if (bVar1) {
          local_288 = &slang::diag::NoMemberImplFound;
        }
        else {
          local_288 = &slang::diag::NoConstraintBody;
        }
        local_de = *local_288;
        Scope::addDiag(pSVar10,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8);
        arg._M_str = in_stack_fffffffffffffd70;
        arg._M_len = in_stack_fffffffffffffd68;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),arg);
      }
      Scope::getCompilation(local_20);
      pIVar5 = BumpAllocator::emplace<slang::ast::InvalidConstraint,decltype(nullptr)>
                         ((BumpAllocator *)this_01,&this_00->_M_ptr);
      in_RDI[2].name._M_len = (size_t)pIVar5;
      local_8 = (Constraint *)in_RDI[2].name._M_len;
    }
    else {
      slang::syntax::SyntaxNode::as<slang::syntax::ConstraintDeclarationSyntax>(local_18);
      pCVar7 = not_null<slang::syntax::ConstraintBlockSyntax_*>::operator*
                         ((not_null<slang::syntax::ConstraintBlockSyntax_*> *)0x335313);
      iVar3 = Constraint::bind((int)pCVar7,local_58,__len_00);
      in_RDI[2].name._M_len = CONCAT44(extraout_var_00,iVar3);
      local_8 = (Constraint *)in_RDI[2].name._M_len;
    }
  }
  else {
    local_8 = (Constraint *)in_RDI[2].name._M_len;
  }
  return local_8;
}

Assistant:

const Constraint& ConstraintBlockSymbol::getConstraints() const {
    if (constraint)
        return *constraint;

    auto syntax = getSyntax();
    auto scope = getParentScope();
    SLANG_ASSERT(syntax && scope);
    ASTContext context(*this, LookupLocation::max);

    if (syntax->kind == SyntaxKind::ConstraintPrototype) {
        // The out-of-block definition must be in our parent scope.
        auto& parentSym = scope->asSymbol();
        auto& outerScope = *parentSym.getParentScope();
        auto& comp = outerScope.getCompilation();

        auto [declSyntax, index, used] = comp.findOutOfBlockDecl(outerScope, parentSym.name, name);
        if (!declSyntax || declSyntax->kind != SyntaxKind::ConstraintDeclaration || name.empty()) {
            if (!flags.has(ConstraintBlockFlags::Pure) && !name.empty()) {
                DiagCode code = flags.has(ConstraintBlockFlags::ExplicitExtern)
                                    ? diag::NoMemberImplFound
                                    : diag::NoConstraintBody;
                outerScope.addDiag(code, location) << name;
            }
            constraint = scope->getCompilation().emplace<InvalidConstraint>(nullptr);
            return *constraint;
        }

        auto& cds = declSyntax->as<ConstraintDeclarationSyntax>();
        *used = true;

        if (flags.has(ConstraintBlockFlags::Pure)) {
            auto& diag = outerScope.addDiag(diag::BodyForPureConstraint, cds.name->sourceRange());
            diag.addNote(diag::NoteDeclarationHere, location);
            constraint = scope->getCompilation().emplace<InvalidConstraint>(nullptr);
            return *constraint;
        }

        // The method definition must be located after the class definition.
        outOfBlockIndex = index;
        if (index <= parentSym.getIndex()) {
            auto& diag = outerScope.addDiag(diag::MemberDefinitionBeforeClass,
                                            cds.name->getLastToken().location());
            diag << name << parentSym.name;
            diag.addNote(diag::NoteDeclarationHere, parentSym.location);
        }

        bool declStatic = false;
        for (auto qual : cds.qualifiers) {
            if (qual.kind == TokenKind::StaticKeyword) {
                declStatic = true;
                break;
            }
        }

        if (declStatic != flags.has(ConstraintBlockFlags::Static)) {
            auto& diag = outerScope.addDiag(diag::MismatchStaticConstraint,
                                            cds.getFirstToken().location());
            diag.addNote(diag::NoteDeclarationHere, location);
        }

        bitmask<ConstraintBlockFlags> declFlags;
        addSpecifierFlags(cds.specifiers, declFlags);

        if (declFlags != (flags & (ConstraintBlockFlags::Initial | ConstraintBlockFlags::Extends |
                                   ConstraintBlockFlags::Final))) {
            auto& diag = outerScope.addDiag(diag::MismatchConstraintSpecifiers,
                                            cds.name->getLastToken().location());
            diag.addNote(diag::NoteDeclarationHere, location);
        }

        constraint = &Constraint::bind(*cds.block, context);
        return *constraint;
    }

    constraint = &Constraint::bind(*syntax->as<ConstraintDeclarationSyntax>().block, context);
    return *constraint;
}